

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CheckObjectName(Parse *pParse,char *zName,char *zType,char *zTblName)

{
  sqlite3 *db;
  char **ppcVar1;
  int iVar2;
  
  db = pParse->db;
  if ((db->flags & 0x10000001) == 1) {
    return 0;
  }
  if (((db->init).field_0x6 & 2) != 0) {
    return 0;
  }
  if (sqlite3Config.bExtraSchemaChecks == '\0') {
    return 0;
  }
  if ((db->init).busy == '\0') {
    if ((pParse->nested != '\0') || (iVar2 = sqlite3_strnicmp(zName,"sqlite_",7), iVar2 != 0)) {
      iVar2 = sqlite3ReadOnlyShadowTables(db);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = sqlite3ShadowTableName(db,zName);
      if (iVar2 == 0) {
        return 0;
      }
    }
    sqlite3ErrorMsg(pParse,"object name reserved for internal use: %s",zName);
  }
  else {
    ppcVar1 = (db->init).azInit;
    iVar2 = sqlite3_stricmp(zType,*ppcVar1);
    if (((iVar2 == 0) && (iVar2 = sqlite3_stricmp(zName,ppcVar1[1]), iVar2 == 0)) &&
       (iVar2 = sqlite3_stricmp(zTblName,ppcVar1[2]), iVar2 == 0)) {
      return 0;
    }
    sqlite3ErrorMsg(pParse,"");
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckObjectName(
  Parse *pParse,            /* Parsing context */
  const char *zName,        /* Name of the object to check */
  const char *zType,        /* Type of this object */
  const char *zTblName      /* Parent table name for triggers and indexes */
){
  sqlite3 *db = pParse->db;
  if( sqlite3WritableSchema(db)
   || db->init.imposterTable
   || !sqlite3Config.bExtraSchemaChecks
  ){
    /* Skip these error checks for writable_schema=ON */
    return SQLITE_OK;
  }
  if( db->init.busy ){
    if( sqlite3_stricmp(zType, db->init.azInit[0])
     || sqlite3_stricmp(zName, db->init.azInit[1])
     || sqlite3_stricmp(zTblName, db->init.azInit[2])
    ){
      sqlite3ErrorMsg(pParse, ""); /* corruptSchema() will supply the error */
      return SQLITE_ERROR;
    }
  }else{
    if( (pParse->nested==0 && 0==sqlite3StrNICmp(zName, "sqlite_", 7))
     || (sqlite3ReadOnlyShadowTables(db) && sqlite3ShadowTableName(db, zName))
    ){
      sqlite3ErrorMsg(pParse, "object name reserved for internal use: %s",
                      zName);
      return SQLITE_ERROR;
    }

  }
  return SQLITE_OK;
}